

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecNorm.c
# Opt level: O2

Gia_Man_t * Acec_InsertBox(Acec_Box_t *pBox,int fAll)

{
  Gia_Man_t *p;
  ulong uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  Gia_Man_t *pNew;
  char *pcVar6;
  Gia_Obj_t *pGVar7;
  Gia_Obj_t *pGVar8;
  Vec_Int_t *pVVar9;
  int iVar10;
  Vec_Int_t *local_48;
  
  p = pBox->pGia;
  pNew = Gia_ManStart(p->nObjs);
  pcVar6 = Abc_UtilStrsav(p->pName);
  pNew->pName = pcVar6;
  pcVar6 = Abc_UtilStrsav(p->pSpec);
  pNew->pSpec = pcVar6;
  Gia_ManFillValue(p);
  p->pObjs->Value = 0;
  for (iVar10 = 0; iVar10 < p->vCis->nSize; iVar10 = iVar10 + 1) {
    iVar2 = Vec_IntEntry(p->vCis,iVar10);
    pGVar7 = Gia_ManObj(p,iVar2);
    if (pGVar7 == (Gia_Obj_t *)0x0) break;
    pGVar8 = Gia_ManAppendObj(pNew);
    uVar1 = *(ulong *)pGVar8;
    *(ulong *)pGVar8 = uVar1 | 0x9fffffff;
    *(ulong *)pGVar8 =
         uVar1 & 0xe0000000ffffffff | 0x9fffffff | (ulong)(pNew->vCis->nSize & 0x1fffffff) << 0x20;
    pVVar9 = pNew->vCis;
    iVar2 = Gia_ObjId(pNew,pGVar8);
    Vec_IntPush(pVVar9,iVar2);
    iVar2 = Gia_ObjId(pNew,pGVar8);
    pGVar7->Value = iVar2 * 2;
  }
  if (fAll == 0) {
    if (pBox->vShared == (Vec_Wec_t *)0x0) {
      __assert_fail("pBox->vShared != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/acec/acecNorm.c"
                    ,0xaf,"Gia_Man_t *Acec_InsertBox(Acec_Box_t *, int)");
    }
    if (pBox->vUnique == (Vec_Wec_t *)0x0) {
      __assert_fail("pBox->vUnique != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/acec/acecNorm.c"
                    ,0xb0,"Gia_Man_t *Acec_InsertBox(Acec_Box_t *, int)");
    }
    pVVar9 = Acec_BuildTree(pNew,p,pBox->vShared,(Vec_Int_t *)0x0);
    local_48 = Acec_BuildTree(pNew,p,pBox->vUnique,pVVar9);
    Vec_IntFree(pVVar9);
  }
  else {
    local_48 = Acec_BuildTree(pNew,p,pBox->vLeafLits,(Vec_Int_t *)0x0);
  }
  for (iVar10 = 0; iVar10 < pBox->vRootLits->nSize; iVar10 = iVar10 + 1) {
    pVVar9 = Vec_WecEntry(pBox->vRootLits,iVar10);
    for (iVar2 = 0; iVar2 < pVVar9->nSize; iVar2 = iVar2 + 1) {
      iVar3 = Vec_IntEntry(pVVar9,iVar2);
      iVar4 = Abc_Lit2Var(iVar3);
      pGVar7 = Gia_ManObj(p,iVar4);
      iVar4 = 0;
      if (iVar2 == 0) {
        iVar4 = Vec_IntEntry(local_48,iVar10);
      }
      iVar3 = Abc_LitIsCompl(iVar3);
      uVar5 = Abc_LitNotCond(iVar4,iVar3);
      pGVar7->Value = uVar5;
    }
  }
  Vec_IntFree(local_48);
  for (iVar10 = 0; iVar10 < p->vCos->nSize; iVar10 = iVar10 + 1) {
    pGVar7 = Gia_ManCo(p,iVar10);
    if (pGVar7 == (Gia_Obj_t *)0x0) break;
    Acec_InsertBox_rec(pNew,p,pGVar7 + -(ulong)((uint)*(undefined8 *)pGVar7 & 0x1fffffff));
  }
  for (iVar10 = 0; iVar10 < p->vCos->nSize; iVar10 = iVar10 + 1) {
    pGVar7 = Gia_ManCo(p,iVar10);
    if (pGVar7 == (Gia_Obj_t *)0x0) break;
    iVar2 = Gia_ObjFanin0Copy(pGVar7);
    iVar3 = Abc_Lit2Var(iVar2);
    if (pNew->nObjs <= iVar3) {
      __assert_fail("iLit0 >= 0 && Abc_Lit2Var(iLit0) < Gia_ManObjNum(p)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                    ,0x315,"int Gia_ManAppendCo(Gia_Man_t *, int)");
    }
    iVar3 = Abc_Lit2Var(iVar2);
    pGVar8 = Gia_ManObj(pNew,iVar3);
    if ((~*(uint *)pGVar8 & 0x1fffffff) != 0 && (int)*(uint *)pGVar8 < 0) {
      __assert_fail("!Gia_ObjIsCo(Gia_ManObj(p, Abc_Lit2Var(iLit0)))",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                    ,0x316,"int Gia_ManAppendCo(Gia_Man_t *, int)");
    }
    pGVar8 = Gia_ManAppendObj(pNew);
    *(ulong *)pGVar8 = *(ulong *)pGVar8 | 0x80000000;
    iVar3 = Gia_ObjId(pNew,pGVar8);
    iVar4 = Abc_Lit2Var(iVar2);
    *(ulong *)pGVar8 = *(ulong *)pGVar8 & 0xffffffffe0000000 | (ulong)(iVar3 - iVar4 & 0x1fffffff);
    iVar2 = Abc_LitIsCompl(iVar2);
    uVar1 = *(ulong *)pGVar8;
    *(ulong *)pGVar8 = uVar1 & 0xffffffffdfffffff | (ulong)(uint)(iVar2 << 0x1d);
    *(ulong *)pGVar8 =
         uVar1 & 0xe0000000dfffffff | (ulong)(uint)(iVar2 << 0x1d) |
         (ulong)(pNew->vCos->nSize & 0x1fffffff) << 0x20;
    pVVar9 = pNew->vCos;
    iVar2 = Gia_ObjId(pNew,pGVar8);
    Vec_IntPush(pVVar9,iVar2);
    if (pNew->pFanData != (int *)0x0) {
      Gia_ObjAddFanout(pNew,pGVar8 + -(ulong)((uint)*(undefined8 *)pGVar8 & 0x1fffffff),pGVar8);
    }
    iVar2 = Gia_ObjId(pNew,pGVar8);
    pGVar7->Value = iVar2 * 2;
  }
  Gia_ManSetRegNum(pNew,p->nRegs);
  return pNew;
}

Assistant:

Gia_Man_t * Acec_InsertBox( Acec_Box_t * pBox, int fAll )
{
    Gia_Man_t * p = pBox->pGia;
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj;
    Vec_Int_t * vRootRanks, * vLevel, * vTemp;
    int i, k, iLit, iLitNew;
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManFillValue(p);
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachCi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi( pNew );
    // implement tree
    if ( fAll )
        vRootRanks = Acec_BuildTree( pNew, p, pBox->vLeafLits, NULL );
    else
    {
        assert( pBox->vShared != NULL );
        assert( pBox->vUnique != NULL );
        vRootRanks = Acec_BuildTree( pNew, p, pBox->vShared, NULL );
        vRootRanks = Acec_BuildTree( pNew, p, pBox->vUnique, vTemp = vRootRanks );
        Vec_IntFree( vTemp );
    }
    // update polarity of literals
    Vec_WecForEachLevel( pBox->vRootLits, vLevel, i )
        Vec_IntForEachEntry( vLevel, iLit, k )
        {
            pObj = Gia_ManObj( p, Abc_Lit2Var(iLit) );
            iLitNew = k ? 0 : Vec_IntEntry( vRootRanks, i );
            pObj->Value = Abc_LitNotCond( iLitNew, Abc_LitIsCompl(iLit) );
        }
    Vec_IntFree( vRootRanks );
    // construct the outputs
    Gia_ManForEachCo( p, pObj, i )
        Acec_InsertBox_rec( pNew, p, Gia_ObjFanin0(pObj) );
    Gia_ManForEachCo( p, pObj, i )
        pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    return pNew;
}